

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall Player::Player(Player *this)

{
  PhaseObserver *this_00;
  Observer *this_01;
  long lVar1;
  long *plVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<GameTokens,_std::allocator<GameTokens>_> gameTokens;
  vector<Cards,_std::allocator<Cards>_> cards;
  Dice dice;
  MonsterCards monsterCard;
  BoardFigures boardFigure;
  vector<GameTokens,_std::allocator<GameTokens>_> local_378;
  vector<Cards,_std::allocator<Cards>_> local_358;
  undefined1 local_340 [32];
  char *local_320;
  char local_310 [16];
  undefined1 *local_300 [2];
  undefined1 local_2f0 [16];
  _Base_ptr local_2e0 [2];
  undefined1 local_2d0 [16];
  _Base_ptr local_2c0;
  undefined1 local_2b0 [16];
  undefined1 *local_2a0;
  undefined1 local_290 [16];
  pointer local_280 [2];
  undefined1 local_270 [16];
  iterator local_260;
  undefined1 local_250 [16];
  undefined1 *local_240;
  undefined1 local_230 [16];
  _Base_ptr local_220 [2];
  undefined1 local_210 [16];
  undefined1 *local_200;
  undefined1 local_1f0 [16];
  long *local_1e0 [2];
  long local_1d0 [2];
  MonsterCards local_1c0;
  MonsterCards local_f8;
  
  Subject::Subject(&this->super_Subject);
  (this->super_Subject)._vptr_Subject = (_func_int **)&PTR_attach_00126960;
  (this->playerName)._M_dataplus._M_p = (pointer)&(this->playerName).field_2;
  (this->playerName)._M_string_length = 0;
  (this->playerName).field_2._M_local_buf[0] = '\0';
  MonsterCards::MonsterCards(&this->monsterCard);
  MonsterCards::MonsterCards(&(this->boardFigure).super_MonsterCards);
  (this->buildingUnitTiles).
  super__Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buildingUnitTiles).
  super__Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gameTokens).super__Vector_base<GameTokens,_std::allocator<GameTokens>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gameTokens).super__Vector_base<GameTokens,_std::allocator<GameTokens>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cards).super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->gameTokens).super__Vector_base<GameTokens,_std::allocator<GameTokens>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cards).super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->cards).super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->buildingUnitTiles).
  super__Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_340._0_8_ = local_340 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"Manhattan","");
  local_320 = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"Manhattan Lower 2-4","");
  local_300[0] = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"Manhattan Midtown 2-4","");
  local_2e0[0] = (_Base_ptr)local_2d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"Manhattan Upper 2-4","");
  local_2c0 = (_Base_ptr)local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"Manhattan Lower 5-6","");
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Manhattan Midtown 5-6","");
  local_280[0] = (pointer)local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"Manhattan Upper 5-6","");
  local_260._M_current =
       (map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
        *)local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Bronx","");
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Queens","");
  local_220[0] = (_Base_ptr)local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"Staten Island","");
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Brooklyn","");
  plVar2 = local_1d0;
  local_1e0[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"None","");
  __l._M_len = 0xc;
  __l._M_array = (iterator)local_340;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->zoneNames,__l,(allocator_type *)&local_1c0);
  lVar1 = -0x180;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  this->victoryPoints = 0;
  this->lifePoints = 10;
  this->energyCubes = 0;
  Dice::Dice((Dice *)local_340);
  MonsterCards::MonsterCards(&local_1c0);
  MonsterCards::MonsterCards(&local_f8);
  local_358.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_358.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_358.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_378.super__Vector_base<GameTokens,_std::allocator<GameTokens>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_378.super__Vector_base<GameTokens,_std::allocator<GameTokens>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.super__Vector_base<GameTokens,_std::allocator<GameTokens>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (PhaseObserver *)operator_new(0x10);
  PhaseObserver::PhaseObserver(this_00,&this->super_Subject);
  (**(this->super_Subject)._vptr_Subject)(this,this_00);
  this_01 = (Observer *)operator_new(8);
  this_01->_vptr_Observer = (_func_int **)0x0;
  Observer::Observer(this_01);
  this_01->_vptr_Observer = (_func_int **)&PTR_update_00126c40;
  (**(this->super_Subject)._vptr_Subject)(this,this_01);
  std::vector<GameTokens,_std::allocator<GameTokens>_>::~vector(&local_378);
  std::vector<Cards,_std::allocator<Cards>_>::~vector(&local_358);
  MonsterCards::~MonsterCards(&local_f8);
  MonsterCards::~MonsterCards(&local_1c0);
  Dice::~Dice((Dice *)local_340);
  return;
}

Assistant:

Player::Player() {
    victoryPoints = 0;
    lifePoints= 10;
    energyCubes = 0;

    Dice dice; // Player dice obj
    MonsterCards monsterCard; // Player monster card
    BoardFigures boardFigure; // Player board fig
    vector <Cards> cards; //List of all deck cards assigned to player (purchased)
    vector <GameTokens> gameTokens; // List of all game tokens assigned to player
    vector <BuildingUnitTiles> buildingUnitTiles; // List of all building tiles assigned to player

    attach(new PhaseObserver(this));
    attach(new GameStatisticsObserver());
}